

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_conf_psk
              (mbedtls_ssl_config *conf,uchar *psk,size_t psk_len,uchar *psk_identity,
              size_t psk_identity_len)

{
  uchar *puVar1;
  size_t psk_identity_len_local;
  uchar *psk_identity_local;
  size_t psk_len_local;
  uchar *psk_local;
  mbedtls_ssl_config *conf_local;
  
  if ((psk == (uchar *)0x0) || (psk_identity == (uchar *)0x0)) {
    conf_local._4_4_ = -0x7100;
  }
  else if (psk_len < 0x21) {
    if ((psk_identity_len >> 0x10 == 0) && (psk_identity_len < 0x4001)) {
      if ((conf->psk != (uchar *)0x0) || (conf->psk_identity != (uchar *)0x0)) {
        free(conf->psk);
        free(conf->psk_identity);
        conf->psk = (uchar *)0x0;
        conf->psk_identity = (uchar *)0x0;
      }
      puVar1 = (uchar *)calloc(1,psk_len);
      conf->psk = puVar1;
      if (puVar1 != (uchar *)0x0) {
        puVar1 = (uchar *)calloc(1,psk_identity_len);
        conf->psk_identity = puVar1;
        if (puVar1 != (uchar *)0x0) {
          conf->psk_len = psk_len;
          conf->psk_identity_len = psk_identity_len;
          memcpy(conf->psk,psk,conf->psk_len);
          memcpy(conf->psk_identity,psk_identity,conf->psk_identity_len);
          return 0;
        }
      }
      free(conf->psk);
      free(conf->psk_identity);
      conf->psk = (uchar *)0x0;
      conf->psk_identity = (uchar *)0x0;
      conf_local._4_4_ = -0x7f00;
    }
    else {
      conf_local._4_4_ = -0x7100;
    }
  }
  else {
    conf_local._4_4_ = -0x7100;
  }
  return conf_local._4_4_;
}

Assistant:

int mbedtls_ssl_conf_psk( mbedtls_ssl_config *conf,
                const unsigned char *psk, size_t psk_len,
                const unsigned char *psk_identity, size_t psk_identity_len )
{
    if( psk == NULL || psk_identity == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    if( psk_len > MBEDTLS_PSK_MAX_LEN )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    /* Identity len will be encoded on two bytes */
    if( ( psk_identity_len >> 16 ) != 0 ||
        psk_identity_len > MBEDTLS_SSL_MAX_CONTENT_LEN )
    {
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    if( conf->psk != NULL || conf->psk_identity != NULL )
    {
        mbedtls_free( conf->psk );
        mbedtls_free( conf->psk_identity );
        conf->psk = NULL;
        conf->psk_identity = NULL;
    }

    if( ( conf->psk = mbedtls_calloc( 1, psk_len ) ) == NULL ||
        ( conf->psk_identity = mbedtls_calloc( 1, psk_identity_len ) ) == NULL )
    {
        mbedtls_free( conf->psk );
        mbedtls_free( conf->psk_identity );
        conf->psk = NULL;
        conf->psk_identity = NULL;
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    conf->psk_len = psk_len;
    conf->psk_identity_len = psk_identity_len;

    memcpy( conf->psk, psk, conf->psk_len );
    memcpy( conf->psk_identity, psk_identity, conf->psk_identity_len );

    return( 0 );
}